

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O3

void __thiscall
diy::RegularLink<diy::Bounds<float>_>::RegularLink
          (RegularLink<diy::Bounds<float>_> *this,int dim,Bounds *core__,Bounds *bounds__)

{
  _Rb_tree_header *p_Var1;
  allocator<float> local_24;
  allocator<float> local_23;
  allocator<float> local_22;
  allocator<float> local_21;
  
  (this->super_Registrar<diy::RegularLink<diy::Bounds<float>_>_>).super_Link.neighbors_.
  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_Registrar<diy::RegularLink<diy::Bounds<float>_>_>).super_Link.neighbors_.
  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_Registrar<diy::RegularLink<diy::Bounds<float>_>_>).super_Link.neighbors_.
  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_Registrar<diy::RegularLink<diy::Bounds<float>_>_>).super_Link.
  super_Factory<diy::Link>._vptr_Factory = (_func_int **)&PTR_id_abi_cxx11__0014b790;
  this->dim_ = dim;
  p_Var1 = &(this->dir_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->dir_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dir_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->dir_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->dir_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->dir_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->dir_vec_).super__Vector_base<diy::Direction,_std::allocator<diy::Direction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dir_vec_).super__Vector_base<diy::Direction,_std::allocator<diy::Direction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dir_vec_).super__Vector_base<diy::Direction,_std::allocator<diy::Direction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::small_vector
            ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)&this->core_,
             (small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)core__,&local_24);
  itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::small_vector
            (&(this->core_).max.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>,
             &(core__->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>,&local_23);
  itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::small_vector
            ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)&this->bounds_,
             (small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)bounds__,&local_22);
  itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::small_vector
            (&(this->bounds_).max.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>,
             &(bounds__->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>,&local_21)
  ;
  (this->wrap_).super__Vector_base<diy::Direction,_std::allocator<diy::Direction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->wrap_).super__Vector_base<diy::Direction,_std::allocator<diy::Direction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nbr_bounds_).super__Vector_base<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nbr_bounds_).super__Vector_base<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nbr_cores_).super__Vector_base<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nbr_bounds_).super__Vector_base<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nbr_cores_).super__Vector_base<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nbr_cores_).super__Vector_base<diy::Bounds<float>,_std::allocator<diy::Bounds<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->wrap_).super__Vector_base<diy::Direction,_std::allocator<diy::Direction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

RegularLink(int dim, const Bounds& core__, const Bounds& bounds__):
                  dim_(dim), core_(core__), bounds_(bounds__) {}